

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_transform.cc
# Opt level: O2

void __thiscall
pass_decouple_generator_ports_Test::TestBody(pass_decouple_generator_ports_Test *this)

{
  Generator *this_00;
  Port *pPVar1;
  Generator *this_01;
  Port *pPVar2;
  Generator *this_02;
  char *message;
  undefined1 local_278 [8];
  Context c;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_150;
  shared_ptr<kratos::Stmt> local_148;
  shared_ptr<kratos::Stmt> local_138;
  shared_ptr<kratos::Stmt> local_128;
  shared_ptr<kratos::Stmt> local_118;
  Port *local_108;
  Port *local_100;
  Port *local_f8;
  Port *local_f0;
  Port *local_e8;
  Port *local_e0;
  Message local_d8;
  AssertHelper local_d0;
  undefined1 auStack_c8 [8];
  VerilogModule verilog;
  AssertionResult gtest_ar;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  src;
  
  kratos::Context::Context((Context *)local_278);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)auStack_c8,"module1",(allocator<char> *)&gtest_ar.message_);
  this_00 = kratos::Context::generator((Context *)local_278,(string *)auStack_c8);
  std::__cxx11::string::~string((string *)auStack_c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)auStack_c8,"in",(allocator<char> *)&gtest_ar.message_);
  local_e0 = kratos::Generator::port(this_00,In,(string *)auStack_c8,1);
  std::__cxx11::string::~string((string *)auStack_c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)auStack_c8,"out",(allocator<char> *)&gtest_ar.message_);
  pPVar1 = kratos::Generator::port(this_00,Out,(string *)auStack_c8,1);
  std::__cxx11::string::~string((string *)auStack_c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)auStack_c8,"module2",(allocator<char> *)&gtest_ar.message_);
  this_01 = kratos::Context::generator((Context *)local_278,(string *)auStack_c8);
  std::__cxx11::string::~string((string *)auStack_c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)auStack_c8,"in",(allocator<char> *)&gtest_ar.message_);
  local_e8 = kratos::Generator::port(this_01,In,(string *)auStack_c8,1);
  std::__cxx11::string::~string((string *)auStack_c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)auStack_c8,"out",(allocator<char> *)&gtest_ar.message_);
  pPVar2 = kratos::Generator::port(this_01,Out,(string *)auStack_c8,1);
  local_100 = pPVar1;
  std::__cxx11::string::~string((string *)auStack_c8);
  local_108 = pPVar2;
  kratos::Var::assign((Var *)auStack_c8,&pPVar2->super_Var,(AssignmentType)local_e8);
  c.tracked_generators_._M_h._M_single_bucket = (__node_base_ptr)auStack_c8;
  _Stack_150._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)verilog.generator_;
  auStack_c8 = (undefined1  [8])0x0;
  verilog.generator_ = (Generator *)0x0;
  kratos::Generator::add_stmt
            (this_01,(shared_ptr<kratos::Stmt> *)&c.tracked_generators_._M_h._M_single_bucket);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_150);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&verilog);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)auStack_c8,"module3",(allocator<char> *)&gtest_ar.message_);
  this_02 = kratos::Context::generator((Context *)local_278,(string *)auStack_c8);
  std::__cxx11::string::~string((string *)auStack_c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)auStack_c8,"in",(allocator<char> *)&gtest_ar.message_);
  pPVar1 = kratos::Generator::port(this_02,In,(string *)auStack_c8,1);
  std::__cxx11::string::~string((string *)auStack_c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)auStack_c8,"out",(allocator<char> *)&gtest_ar.message_);
  pPVar2 = kratos::Generator::port(this_02,Out,(string *)auStack_c8,1);
  std::__cxx11::string::~string((string *)auStack_c8);
  local_f8 = pPVar1;
  local_f0 = pPVar2;
  kratos::Var::assign((Var *)auStack_c8,&pPVar2->super_Var,(AssignmentType)pPVar1);
  local_148.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)auStack_c8;
  local_148.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)verilog.generator_;
  auStack_c8 = (undefined1  [8])0x0;
  verilog.generator_ = (Generator *)0x0;
  kratos::Generator::add_stmt(this_02,&local_148);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_148.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&verilog);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)auStack_c8,"inst0",(allocator<char> *)&verilog.manager_.collect_perf_);
  std::__shared_ptr<kratos::Generator,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<kratos::Generator,void>
            ((__shared_ptr<kratos::Generator,(__gnu_cxx::_Lock_policy)2> *)&gtest_ar.message_,
             (__weak_ptr<kratos::Generator,_(__gnu_cxx::_Lock_policy)2> *)
             &this_01->super_enable_shared_from_this<kratos::Generator>);
  kratos::Generator::add_child_generator
            (this_00,(string *)auStack_c8,(shared_ptr<kratos::Generator> *)&gtest_ar.message_);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&src);
  std::__cxx11::string::~string((string *)auStack_c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)auStack_c8,"inst1",(allocator<char> *)&verilog.manager_.collect_perf_);
  std::__shared_ptr<kratos::Generator,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<kratos::Generator,void>
            ((__shared_ptr<kratos::Generator,(__gnu_cxx::_Lock_policy)2> *)&gtest_ar.message_,
             (__weak_ptr<kratos::Generator,_(__gnu_cxx::_Lock_policy)2> *)
             &this_02->super_enable_shared_from_this<kratos::Generator>);
  kratos::Generator::add_child_generator
            (this_00,(string *)auStack_c8,(shared_ptr<kratos::Generator> *)&gtest_ar.message_);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&src);
  std::__cxx11::string::~string((string *)auStack_c8);
  kratos::Var::assign((Var *)auStack_c8,&local_e8->super_Var);
  local_138.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)auStack_c8;
  local_138.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)verilog.generator_;
  auStack_c8 = (undefined1  [8])0x0;
  verilog.generator_ = (Generator *)0x0;
  kratos::Generator::add_stmt(this_00,&local_138);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_138.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&verilog);
  kratos::Var::assign((Var *)auStack_c8,&local_f8->super_Var);
  local_128.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)auStack_c8;
  local_128.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)verilog.generator_;
  auStack_c8 = (undefined1  [8])0x0;
  verilog.generator_ = (Generator *)0x0;
  kratos::Generator::add_stmt(this_00,&local_128);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_128.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&verilog);
  kratos::Var::operator+(&local_108->super_Var,&local_f0->super_Var);
  kratos::Var::assign((Var *)auStack_c8,&local_100->super_Var);
  local_118.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)auStack_c8;
  local_118.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)verilog.generator_;
  auStack_c8 = (undefined1  [8])0x0;
  verilog.generator_ = (Generator *)0x0;
  kratos::Generator::add_stmt(this_00,&local_118);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_118.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&verilog);
  kratos::VerilogModule::VerilogModule((VerilogModule *)auStack_c8,this_00);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gtest_ar.message_,"fix_assignment_type",
             (allocator<char> *)&verilog.manager_.collect_perf_);
  kratos::PassManager::add_pass((PassManager *)&verilog,(string *)&gtest_ar.message_);
  std::__cxx11::string::~string((string *)&gtest_ar.message_);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gtest_ar.message_,"decouple_generator_ports",
             (allocator<char> *)&verilog.manager_.collect_perf_);
  kratos::PassManager::add_pass((PassManager *)&verilog,(string *)&gtest_ar.message_);
  std::__cxx11::string::~string((string *)&gtest_ar.message_);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gtest_ar.message_,"check_mixed_assignment",
             (allocator<char> *)&verilog.manager_.collect_perf_);
  kratos::PassManager::add_pass((PassManager *)&verilog,(string *)&gtest_ar.message_);
  std::__cxx11::string::~string((string *)&gtest_ar.message_);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gtest_ar.message_,"create_module_instantiation",
             (allocator<char> *)&verilog.manager_.collect_perf_);
  kratos::PassManager::add_pass((PassManager *)&verilog,(string *)&gtest_ar.message_);
  std::__cxx11::string::~string((string *)&gtest_ar.message_);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gtest_ar.message_,"hash_generators_parallel",
             (allocator<char> *)&verilog.manager_.collect_perf_);
  kratos::PassManager::add_pass((PassManager *)&verilog,(string *)&gtest_ar.message_);
  std::__cxx11::string::~string((string *)&gtest_ar.message_);
  kratos::VerilogModule::run_passes((VerilogModule *)auStack_c8);
  kratos::VerilogModule::verilog_src_abi_cxx11_
            ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&gtest_ar.message_,(VerilogModule *)auStack_c8);
  local_d8.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )(unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )src._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
  local_d0.data_._0_4_ = 3;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&verilog.manager_.collect_perf_,"src.size()","3",(unsigned_long *)&local_d8
             ,(int *)&local_d0);
  if (verilog.manager_.collect_perf_ == false) {
    testing::Message::Message(&local_d8);
    if (gtest_ar._0_8_ == 0) {
      message = "";
    }
    else {
      message = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/tests/test_transform.cc"
               ,0x70,message);
    testing::internal::AssertHelper::operator=(&local_d0,&local_d8);
    testing::internal::AssertHelper::~AssertHelper(&local_d0);
    if (local_d8.ss_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl !=
        (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )0x0) {
      (**(code **)(*(long *)local_d8.ss_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&gtest_ar);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&gtest_ar.message_);
  kratos::PassManager::~PassManager((PassManager *)&verilog);
  kratos::Context::~Context((Context *)local_278);
  return;
}

Assistant:

TEST(pass, decouple_generator_ports) {  // NOLINT
    Context c;
    auto &mod1 = c.generator("module1");
    auto &in1 = mod1.port(PortDirection::In, "in", 1);
    auto &out1 = mod1.port(PortDirection::Out, "out", 1);

    auto &mod2 = c.generator("module2");
    auto &in2 = mod2.port(PortDirection::In, "in", 1);
    auto &out2 = mod2.port(PortDirection::Out, "out", 1);
    mod2.add_stmt(out2.assign(in2, AssignmentType::Blocking));

    auto &mod3 = c.generator("module3");
    auto &in3 = mod3.port(PortDirection::In, "in", 1);
    auto &out3 = mod3.port(PortDirection::Out, "out", 1);
    mod3.add_stmt(out3.assign(in3, AssignmentType::Blocking));

    mod1.add_child_generator("inst0", mod2.shared_from_this());
    mod1.add_child_generator("inst1", mod3.shared_from_this());

    mod1.add_stmt(in2.assign(in1));
    mod1.add_stmt(in3.assign(in1));

    mod1.add_stmt(out1.assign(out2 + out3));

    VerilogModule verilog(&mod1);
    PassManager &manager = verilog.pass_manager();
    manager.add_pass("fix_assignment_type");
    manager.add_pass("decouple_generator_ports");
    manager.add_pass("check_mixed_assignment");
    manager.add_pass("create_module_instantiation");
    manager.add_pass("hash_generators_parallel");
    verilog.run_passes();
    auto src = verilog.verilog_src();
    EXPECT_EQ(src.size(), 3);
}